

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O2

void __thiscall PSO::printResult(PSO *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"PSO Predicted Point : ");
  poVar1 = std::ostream::_M_insert<double>
                     (*(this->result).first.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  std::operator<<(poVar1," , ");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->result).first.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Error : ");
  poVar1 = std::ostream::_M_insert<double>((this->result).second);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

auto printResult() -> void
    {
        cout << "PSO Predicted Point : " << result.first[0] << " , " << result.first[1] << endl;
        cout << "Error : " << result.second << endl;
    }